

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Dequote(char *z)

{
  int local_1c;
  int local_18;
  int j;
  int i;
  char quote;
  char *z_local;
  
  if ((z != (char *)0x0) && (j._3_1_ = *z, (""[j._3_1_] & 0x80) != 0)) {
    if (j._3_1_ == 0x5b) {
      j._3_1_ = 0x5d;
    }
    local_18 = 1;
    local_1c = 0;
    do {
      if (z[local_18] == j._3_1_) {
        if (z[local_18 + 1] != j._3_1_) {
          z[local_1c] = '\0';
          return;
        }
        z[local_1c] = j._3_1_;
        local_18 = local_18 + 1;
      }
      else {
        z[local_1c] = z[local_18];
      }
      local_1c = local_1c + 1;
      local_18 = local_18 + 1;
    } while( true );
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Dequote(char *z){
  char quote;
  int i, j;
  if( z==0 ) return;
  quote = z[0];
  if( !sqlite3Isquote(quote) ) return;
  if( quote=='[' ) quote = ']';
  for(i=1, j=0;; i++){
    assert( z[i] );
    if( z[i]==quote ){
      if( z[i+1]==quote ){
        z[j++] = quote;
        i++;
      }else{
        break;
      }
    }else{
      z[j++] = z[i];
    }
  }
  z[j] = 0;
}